

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O3

void __thiscall
TPZFrontSym<long_double>::ExtractFrontMatrix
          (TPZFrontSym<long_double> *this,TPZFMatrix<long_double> *front)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  longdouble *plVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long local_68;
  long local_50;
  
  lVar1 = (this->super_TPZFront<long_double>).fLocal.fNElements;
  if (lVar1 < 1) {
    lVar7 = 0;
  }
  else {
    lVar6 = 0;
    do {
      lVar7 = lVar6;
      if ((this->super_TPZFront<long_double>).fLocal.fStore[lVar6] != -1) break;
      lVar6 = lVar6 + 1;
      lVar7 = lVar1;
    } while (lVar1 != lVar6);
  }
  (*(front->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe]
  )(front,lVar1 - lVar7);
  if (lVar7 < lVar1) {
    local_68 = 0;
    local_50 = 0;
    lVar6 = lVar7;
    do {
      if ((this->super_TPZFront<long_double>).fLocal.fStore[lVar6] != -1) {
        lVar11 = lVar6 - lVar7;
        lVar9 = local_50;
        lVar10 = local_68;
        do {
          plVar2 = (this->super_TPZFront<long_double>).fLocal.fStore;
          lVar5 = plVar2[lVar7 + lVar9];
          if (lVar5 != -1) {
            lVar3 = plVar2[lVar6];
            lVar8 = lVar5;
            if (lVar5 < lVar3) {
              lVar8 = lVar3;
            }
            if (lVar3 < lVar5) {
              lVar5 = lVar3;
            }
            lVar8 = (lVar8 + 1) * lVar8;
            lVar3 = (front->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
            if (((lVar3 <= lVar11 || lVar11 < 0) || (lVar9 < 0)) ||
               ((front->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar9)) {
              TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            plVar4 = front->fElem;
            plVar4[lVar3 * lVar9 + lVar11] =
                 *(longdouble *)
                  ((long)(this->super_TPZFront<long_double>).fData.fStore +
                  lVar5 * 0x10 + (lVar8 - (lVar8 >> 0x3f) & 0xfffffffffffffffeU) * 8);
            if (((lVar3 <= lVar11 || lVar11 < 0) || (lVar9 < 0)) ||
               ((front->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar9)) {
              TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if (((lVar9 < 0) || (lVar3 <= lVar9)) ||
               ((lVar11 < 0 ||
                ((front->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar11)))) {
              TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            *(longdouble *)((long)plVar4 + lVar10 + lVar3 * local_68) =
                 plVar4[lVar3 * lVar9 + lVar11];
          }
          lVar10 = lVar10 + 0x10;
          lVar5 = lVar7 + lVar9;
          lVar9 = lVar9 + 1;
        } while (lVar5 + 1 < lVar1);
      }
      lVar6 = lVar6 + 1;
      local_50 = local_50 + 1;
      local_68 = local_68 + 0x10;
    } while (lVar6 != lVar1);
  }
  return;
}

Assistant:

void TPZFrontSym<TVar>::ExtractFrontMatrix(TPZFMatrix<TVar> &front)
{
	int64_t maxeq = this->fLocal.NElements();
	int64_t mineq = 0;
	for(mineq=0; mineq<maxeq; mineq++) if(this->fLocal[mineq] != -1) break;
	int64_t numeq = maxeq-mineq;
	front.Redim(numeq,numeq);
	int64_t ieq,jeq;
	for(ieq=mineq;ieq<maxeq;ieq++) {
		if(this->fLocal[ieq] == -1) continue;
		int64_t il = ieq-mineq;
		for(jeq=ieq;jeq<maxeq;jeq++) {
			if(this->fLocal[jeq] == -1) continue;
			int64_t jl = jeq-mineq;
			front(il,jl) = this->Element(this->fLocal[ieq],this->fLocal[jeq]);
			front(jl,il) = front(il,jl);
		}
	}
	
}